

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O1

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::KeyEvent,QWindow*,unsigned_long,QEvent::Type,int,QFlags<Qt::KeyboardModifier>,unsigned_int,unsigned_int,unsigned_int,QString,bool,unsigned_short>
               (QWindow *args,unsigned_long args_1,Type args_2,int args_3,
               QFlags<Qt::KeyboardModifier> args_4,uint args_5,uint args_6,uint args_7,
               QString args_8,bool args_9,unsigned_short args_10)

{
  long lVar1;
  QString args_8_00;
  char cVar2;
  undefined1 uVar3;
  int iVar4;
  QInputDevice *device;
  long in_FS_OFFSET;
  QArrayData *local_f0;
  qsizetype local_e8;
  undefined8 local_e0;
  QString local_d8;
  KeyEvent event;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0xa7;
  cVar2 = QThread::isMainThread();
  if (cVar2 == '\0') {
    local_f0 = *(QArrayData **)&(args_8.d.d)->super_QArrayData;
    local_e8 = ((args_8.d.d)->super_QArrayData).alloc;
    local_e0._0_4_ = args_8.d.d[1].super_QArrayData.ref_;
    local_e0._4_4_ = args_8.d.d[1].super_QArrayData.flags;
    if (local_f0 != (QArrayData *)0x0) {
      LOCK();
      (local_f0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_f0->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    args_8_00.d.ptr._0_1_ = args_8.d.ptr._0_1_;
    args_8_00.d.d = (Data *)&local_f0;
    args_8_00.d.ptr._1_7_ = 0;
    args_8_00.d.size._0_2_ = (ushort)args_8.d.size;
    args_8_00.d.size._2_6_ = 0;
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::KeyEvent,QWindow*,unsigned_long,QEvent::Type,int,QFlags<Qt::KeyboardModifier>,unsigned_int,unsigned_int,unsigned_int,QString,bool,unsigned_short>
              (args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,args_8_00,(bool)uVar3,
               (unsigned_short)args_5);
    if (local_f0 != (QArrayData *)0x0) {
      LOCK();
      (local_f0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_f0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_f0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_f0,2,0x10);
      }
    }
    uVar3 = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
    goto LAB_003329af;
  }
  event._112_8_ = &DAT_aaaaaaaaaaaaaaaa;
  event._120_8_ = &DAT_aaaaaaaaaaaaaaaa;
  event.unicode.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  event._104_8_ = &DAT_aaaaaaaaaaaaaaaa;
  event.unicode.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  event.unicode.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  event.source = (QInputDevice *)&DAT_aaaaaaaaaaaaaaaa;
  event._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
  event.super_InputEvent._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  event.super_InputEvent.device = (QInputDevice *)&DAT_aaaaaaaaaaaaaaaa;
  event.super_InputEvent.super_UserEvent.window.wp.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  event.super_InputEvent.super_UserEvent.timestamp = (unsigned_long)&DAT_aaaaaaaaaaaaaaaa;
  event.super_InputEvent.super_UserEvent.super_WindowSystemEvent._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  event.super_InputEvent.super_UserEvent.window.wp.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  event.super_InputEvent.super_UserEvent.super_WindowSystemEvent._vptr_WindowSystemEvent =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  event.super_InputEvent.super_UserEvent.super_WindowSystemEvent._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_d8.d.d = (Data *)0x0;
  local_d8.d.ptr = (char16_t *)0x0;
  local_d8.d.size = 0;
  device = QInputDevice::primaryKeyboard(&local_d8);
  QWindowSystemInterfacePrivate::KeyEvent::KeyEvent
            (&event,args,args_1,args_2,args_3,
             (KeyboardModifiers)
             args_4.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
             super_QFlagsStorage<Qt::KeyboardModifier>.i,args_5,args_6,args_7,(QString *)args_8.d.d,
             args_8.d.ptr._0_1_,(ushort)args_8.d.size,device);
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent((WindowSystemEvent *)&event);
LAB_00332944:
    uVar3 = event.super_InputEvent.super_UserEvent.super_WindowSystemEvent.eventAccepted;
  }
  else {
    iVar4 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,&event);
    if ((char)iVar4 != '\0') goto LAB_00332944;
    uVar3 = 0;
  }
  event.super_InputEvent.super_UserEvent.super_WindowSystemEvent._vptr_WindowSystemEvent =
       (_func_int **)&PTR__KeyEvent_007e9fb8;
  if (event.unicode.d.d != (Data *)0x0) {
    LOCK();
    ((event.unicode.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((event.unicode.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((event.unicode.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(event.unicode.d.d)->super_QArrayData,2,0x10);
    }
  }
  event.super_InputEvent.super_UserEvent.super_WindowSystemEvent._vptr_WindowSystemEvent =
       (_func_int **)&PTR__UserEvent_007e5280;
  if (event.super_InputEvent.super_UserEvent.window.wp.d != (Data *)0x0) {
    LOCK();
    ((event.super_InputEvent.super_UserEvent.window.wp.d)->weakref)._q_value.
    super___atomic_base<int>._M_i =
         ((event.super_InputEvent.super_UserEvent.window.wp.d)->weakref)._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((event.super_InputEvent.super_UserEvent.window.wp.d)->weakref)._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (event.super_InputEvent.super_UserEvent.window.wp.d != (Data *)0x0)) {
      operator_delete(event.super_InputEvent.super_UserEvent.window.wp.d);
    }
  }
LAB_003329af:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)uVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}